

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duseltronik.hpp
# Opt level: O1

bool tao::pegtl::internal::
     duseltronik<ovf::detail::parse::v2::line_data_csv,(tao::pegtl::apply_mode)1,(tao::pegtl::rewind_mode)0,ovf::detail::parse::v2::ovf_segment_data_action,tao::pegtl::normal,(tao::pegtl::internal::dusel_mode)2>
     ::
     match<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,ovf_file&,ovf_segment_const&,float*&>
               (memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,ovf_file *st,ovf_segment *st_1,float **st_2)

{
  int *piVar1;
  parser_state *ppVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  iterator_t *piVar8;
  
  piVar8 = &(in->
            super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_current;
  pcVar3 = (in->
           super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).m_current.data;
  sVar4 = (in->
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).m_current.byte;
  sVar5 = (in->
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).m_current.line;
  sVar6 = (in->
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).m_current.byte_in_line;
  bVar7 = rule_conjunction<tao::pegtl::list<tao::pegtl::pad<ovf::detail::parse::v2::text_value_float,_tao::pegtl::ascii::blank,_tao::pegtl::ascii::blank>,_tao::pegtl::ascii::one<','>,_void>,_tao::pegtl::opt<tao::pegtl::pad<tao::pegtl::ascii::one<','>,_tao::pegtl::ascii::blank,_tao::pegtl::ascii::blank>_>_>
          ::
          match<(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)0,_ovf::detail::parse::v2::ovf_segment_data_action,_tao::pegtl::normal,_tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ovf_file_&,_const_ovf_segment_&,_float_*&>
                    (in,st,st_1,st_2);
  if (bVar7) {
    ppVar2 = st->_state;
    ppVar2->current_column = 0;
    piVar1 = &ppVar2->current_line;
    *piVar1 = *piVar1 + 1;
    piVar8 = (iterator_t *)0x0;
  }
  if (piVar8 != (iterator_t *)0x0) {
    piVar8->line = sVar5;
    piVar8->byte_in_line = sVar6;
    piVar8->data = pcVar3;
    piVar8->byte = sVar4;
  }
  return bVar7;
}

Assistant:

static bool match( Input& in, States&&... st )
            {
               auto m = in.template mark< rewind_mode::required >();

               Control< Rule >::start( static_cast< const Input& >( in ), st... );

               if( duseltronik< Rule, A, rewind_mode::active, Action, Control, dusel_mode::nothing >::match( in, st... ) ) {
                  Control< Rule >::template apply< Action >( m.iterator(), static_cast< const Input& >( in ), st... );
                  Control< Rule >::success( static_cast< const Input& >( in ), st... );
                  return m( true );
               }
               Control< Rule >::failure( static_cast< const Input& >( in ), st... );
               return false;
            }